

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O1

int __thiscall JetHead::IReaderWriter::writeAll(IReaderWriter *this,void *buffer,int length)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  do {
    if (length <= (int)uVar3) {
      return uVar3;
    }
    iVar1 = (*this->_vptr_IReaderWriter[3])(this,(ulong)uVar3 + (long)buffer);
    iVar2 = 0;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    uVar3 = uVar3 + iVar2;
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

virtual int writeAll(const void *buffer, int length)
		{
			int bytesWritten = 0;
			
			while (bytesWritten < length)
			{
				int result = write((uint8_t*)buffer + bytesWritten,
								   length - bytesWritten);
				if (result < 0)
					return result;
	
				bytesWritten += result;
			}
			return bytesWritten;
		}